

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

void Set_LTWH_Anims_On(Am_Object *obj,Am_Slot_Key color_slot,bool wh)

{
  ushort uVar1;
  ulong uVar2;
  ushort uVar3;
  Am_Object local_38;
  Am_Object animc;
  Am_Object local_20;
  Am_Object animlt;
  bool wh_local;
  Am_Slot_Key color_slot_local;
  Am_Object *obj_local;
  
  uVar3 = (ushort)obj;
  animlt.data._5_1_ = wh;
  animlt.data._6_2_ = color_slot;
  Am_Object::Get(uVar3,100);
  Am_Object::Get(uVar3,0x65);
  if ((animlt.data._5_1_ & 1) != 0) {
    Am_Object::Get(uVar3,0x66);
    Am_Object::Get(uVar3,0x67);
  }
  Am_Object::Create((char *)&local_20);
  uVar2 = Am_Animate_With((Am_Object *)&local_20);
  uVar1 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,uVar2);
  uVar2 = Am_Animate_With((Am_Object *)&local_20);
  Am_Object::Set(uVar1,(Am_Constraint *)0x65,uVar2);
  if ((animlt.data._5_1_ & 1) != 0) {
    uVar2 = Am_Animate_With((Am_Object *)&local_20);
    uVar1 = Am_Object::Set(uVar3,(Am_Constraint *)0x66,uVar2);
    uVar2 = Am_Animate_With((Am_Object *)&local_20);
    Am_Object::Set(uVar1,(Am_Constraint *)0x67,uVar2);
  }
  if (animlt.data._6_2_ != 0) {
    Am_Object::Create((char *)&local_38);
    uVar1 = animlt.data._6_2_;
    uVar2 = Am_Animate_With((Am_Object *)&local_38);
    Am_Object::Set(uVar3,(Am_Constraint *)(ulong)uVar1,uVar2);
    Am_Object::~Am_Object(&local_38);
  }
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

void
Set_LTWH_Anims_On(Am_Object &obj, Am_Slot_Key color_slot, bool wh)
{
  obj.Get(Am_LEFT); //evaluate these before putting in the animation
  obj.Get(Am_TOP);  //evaluate these before putting in the animation
  if (wh) {
    obj.Get(Am_WIDTH);  //evaluate these before putting in the animation
    obj.Get(Am_HEIGHT); //evaluate these before putting in the animation
  }
  Am_Object animlt = animator_proto.Create();
  obj.Set(Am_LEFT, Am_Animate_With(animlt))
      .Set(Am_TOP, Am_Animate_With(animlt));
  if (wh) {
    obj.Set(Am_WIDTH, Am_Animate_With(animlt))
        .Set(Am_HEIGHT, Am_Animate_With(animlt));
  }
  if (color_slot) {
    Am_Object animc = color_anim_proto.Create("line_color_anim");
    obj.Set(color_slot, Am_Animate_With(animc));
  }
}